

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathEvalPredicate(xmlXPathContextPtr ctxt,xmlXPathObjectPtr res)

{
  int iVar1;
  bool local_29;
  xmlXPathObjectPtr res_local;
  xmlXPathContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathContextPtr)0x0) || (res == (xmlXPathObjectPtr)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    switch(res->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      if (res->nodesetval == (xmlNodeSetPtr)0x0) {
        ctxt_local._4_4_ = 0;
      }
      else {
        ctxt_local._4_4_ = (uint)(res->nodesetval->nodeNr != 0);
      }
      break;
    case XPATH_BOOLEAN:
      ctxt_local._4_4_ = res->boolval;
      break;
    case XPATH_NUMBER:
      ctxt_local._4_4_ = (uint)(res->floatval == (double)ctxt->proximityPosition);
      break;
    case XPATH_STRING:
      local_29 = false;
      if (res->stringval != (xmlChar *)0x0) {
        iVar1 = xmlStrlen(res->stringval);
        local_29 = iVar1 != 0;
      }
      ctxt_local._4_4_ = (uint)local_29;
      break;
    default:
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathEvalPredicate(xmlXPathContextPtr ctxt, xmlXPathObjectPtr res) {
    if ((ctxt == NULL) || (res == NULL)) return(0);
    switch (res->type) {
        case XPATH_BOOLEAN:
	    return(res->boolval);
        case XPATH_NUMBER:
	    return(res->floatval == ctxt->proximityPosition);
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    if (res->nodesetval == NULL)
		return(0);
	    return(res->nodesetval->nodeNr != 0);
        case XPATH_STRING:
	    return((res->stringval != NULL) &&
	           (xmlStrlen(res->stringval) != 0));
        default:
	    break;
    }
    return(0);
}